

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8_t * __thiscall
google::protobuf::FileDescriptorProto::_InternalSerialize
          (FileDescriptorProto *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  size_t sVar1;
  FileOptions *value;
  SourceCodeInfo *value_00;
  ulong uVar2;
  anon_union_232_1_493b367e_for_FileDescriptorProto_3 aVar3;
  int iVar4;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar5;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
  *value_01;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>_>
  *value_02;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>_>
  *value_03;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *value_04;
  uint8_t *puVar6;
  const_reference piVar7;
  int iVar8;
  char *in_R9;
  undefined8 *puVar9;
  RepeatedField<int> *pRVar10;
  string_view s;
  string_view s_00;
  string_view s_01;
  string_view s_02;
  string_view s_03;
  string_view field_name;
  string_view field_name_00;
  string_view field_name_01;
  string_view field_name_02;
  string_view field_name_03;
  
  aVar3 = this->field_0;
  if (((undefined1  [232])aVar3 & (undefined1  [232])0x1) != (undefined1  [232])0x0) {
    puVar9 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    field_name._M_str = in_R9;
    field_name._M_len = (size_t)"google.protobuf.FileDescriptorProto.name";
    internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar9,(char *)(ulong)*(uint *)(puVar9 + 1),1,0x28,field_name);
    s._M_str = (char *)*puVar9;
    s._M_len = puVar9[1];
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,1,s,target);
  }
  if (((undefined1  [232])aVar3 & (undefined1  [232])0x2) != (undefined1  [232])0x0) {
    puVar9 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.package_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    field_name_00._M_str = in_R9;
    field_name_00._M_len = (size_t)"google.protobuf.FileDescriptorProto.package";
    internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar9,(char *)(ulong)*(uint *)(puVar9 + 1),1,0x2b,field_name_00);
    s_00._M_str = (char *)*puVar9;
    s_00._M_len = puVar9[1];
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,2,s_00,target);
  }
  iVar4 = *(int *)((long)&this->field_0 + 0x10);
  iVar8 = 0;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  for (; iVar4 != iVar8; iVar8 = iVar8 + 1) {
    pVVar5 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                       (&(this->field_0)._impl_.dependency_.super_RepeatedPtrFieldBase,iVar8);
    field_name_01._M_str = in_R9;
    field_name_01._M_len = (size_t)"google.protobuf.FileDescriptorProto.dependency";
    internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)(pVVar5->_M_dataplus)._M_p,
               (char *)(ulong)(uint)pVVar5->_M_string_length,1,0x2e,field_name_01);
    sVar1 = pVVar5->_M_string_length;
    if (((long)sVar1 < 0x80) && ((long)sVar1 <= (long)(stream->end_ + (0xe - (long)target)))) {
      *target = '\x1a';
      target[1] = (uint8_t)sVar1;
      memcpy(target + 2,(pVVar5->_M_dataplus)._M_p,sVar1);
      target = target + sVar1 + 2;
    }
    else {
      s_01._M_str = (pVVar5->_M_dataplus)._M_p;
      s_01._M_len = sVar1;
      target = io::EpsCopyOutputStream::WriteStringOutline(stream,3,s_01,target);
    }
  }
  iVar4 = *(int *)((long)&this->field_0 + 0x28);
  for (iVar8 = 0; iVar4 != iVar8; iVar8 = iVar8 + 1) {
    value_01 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                         (&(this->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase,iVar8);
    target = internal::WireFormatLite::InternalWriteMessage
                       (4,(MessageLite *)value_01,(value_01->field_0)._impl_._cached_size_.atom_,
                        target,stream);
  }
  iVar4 = *(int *)((long)&this->field_0 + 0x40);
  for (iVar8 = 0; iVar4 != iVar8; iVar8 = iVar8 + 1) {
    value_02 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                         (&(this->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,iVar8);
    target = internal::WireFormatLite::InternalWriteMessage
                       (5,(MessageLite *)value_02,(value_02->field_0)._impl_._cached_size_.atom_,
                        target,stream);
  }
  iVar4 = *(int *)((long)&this->field_0 + 0x58);
  for (iVar8 = 0; iVar4 != iVar8; iVar8 = iVar8 + 1) {
    value_03 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>>
                         (&(this->field_0)._impl_.service_.super_RepeatedPtrFieldBase,iVar8);
    target = internal::WireFormatLite::InternalWriteMessage
                       (6,(MessageLite *)value_03,(value_03->field_0)._impl_._cached_size_.atom_,
                        target,stream);
  }
  iVar4 = *(int *)((long)&this->field_0 + 0x70);
  for (iVar8 = 0; iVar4 != iVar8; iVar8 = iVar8 + 1) {
    value_04 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                         (&(this->field_0)._impl_.extension_.super_RepeatedPtrFieldBase,iVar8);
    target = internal::WireFormatLite::InternalWriteMessage
                       (7,(MessageLite *)value_04,(value_04->field_0)._impl_._cached_size_.atom_,
                        target,stream);
  }
  if (((undefined1  [232])aVar3 & (undefined1  [232])0x8) != (undefined1  [232])0x0) {
    value = (this->field_0)._impl_.options_;
    target = internal::WireFormatLite::InternalWriteMessage
                       (8,(MessageLite *)value,(value->field_0)._impl_._cached_size_.atom_,target,
                        stream);
  }
  if (((undefined1  [232])aVar3 & (undefined1  [232])0x10) != (undefined1  [232])0x0) {
    value_00 = (this->field_0)._impl_.source_code_info_;
    target = internal::WireFormatLite::InternalWriteMessage
                       (9,(MessageLite *)value_00,(value_00->field_0)._impl_._cached_size_.atom_,
                        target,stream);
  }
  pRVar10 = &(this->field_0)._impl_.public_dependency_;
  iVar4 = RepeatedField<int>::size(pRVar10);
  iVar8 = 0;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  for (; iVar4 != iVar8; iVar8 = iVar8 + 1) {
    puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    piVar7 = RepeatedField<int>::Get(pRVar10,iVar8);
    target = internal::WireFormatLite::WriteInt32ToArray(10,*piVar7,puVar6);
  }
  pRVar10 = &(this->field_0)._impl_.weak_dependency_;
  iVar4 = RepeatedField<int>::size(pRVar10);
  iVar8 = 0;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  for (; iVar4 != iVar8; iVar8 = iVar8 + 1) {
    puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    piVar7 = RepeatedField<int>::Get(pRVar10,iVar8);
    target = internal::WireFormatLite::WriteInt32ToArray(0xb,*piVar7,puVar6);
  }
  if (((undefined1  [232])aVar3 & (undefined1  [232])0x4) != (undefined1  [232])0x0) {
    puVar9 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.syntax_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    field_name_02._M_str = in_R9;
    field_name_02._M_len = (size_t)"google.protobuf.FileDescriptorProto.syntax";
    internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar9,(char *)(ulong)*(uint *)(puVar9 + 1),1,0x2a,field_name_02);
    s_02._M_str = (char *)*puVar9;
    s_02._M_len = puVar9[1];
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,0xc,s_02,target);
  }
  if (((undefined1  [232])aVar3 & (undefined1  [232])0x20) != (undefined1  [232])0x0) {
    puVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = internal::WireFormatLite::WriteEnumToArray(0xe,(this->field_0)._impl_.edition_,puVar6);
  }
  iVar4 = *(int *)((long)&this->field_0 + 0xa8);
  iVar8 = 0;
  if (iVar4 < 1) {
    iVar4 = iVar8;
  }
  for (; iVar4 != iVar8; iVar8 = iVar8 + 1) {
    pVVar5 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                       (&(this->field_0)._impl_.option_dependency_.super_RepeatedPtrFieldBase,iVar8)
    ;
    field_name_03._M_str = in_R9;
    field_name_03._M_len = (size_t)"google.protobuf.FileDescriptorProto.option_dependency";
    internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)(pVVar5->_M_dataplus)._M_p,
               (char *)(ulong)(uint)pVVar5->_M_string_length,1,0x35,field_name_03);
    sVar1 = pVVar5->_M_string_length;
    if (((long)sVar1 < 0x80) && ((long)sVar1 <= (long)(stream->end_ + (0xe - (long)target)))) {
      *target = 'z';
      target[1] = (uint8_t)sVar1;
      memcpy(target + 2,(pVVar5->_M_dataplus)._M_p,sVar1);
      target = target + sVar1 + 2;
    }
    else {
      s_03._M_str = (pVVar5->_M_dataplus)._M_p;
      s_03._M_len = sVar1;
      target = io::EpsCopyOutputStream::WriteStringOutline(stream,0xf,s_03,target);
    }
  }
  uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    puVar6 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar6;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL FileDescriptorProto::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const FileDescriptorProto& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FileDescriptorProto)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional string name = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_name();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.FileDescriptorProto.name");
    target = stream->WriteStringMaybeAliased(1, _s, target);
  }

  // optional string package = 2;
  if ((cached_has_bits & 0x00000002u) != 0) {
    const ::std::string& _s = this_._internal_package();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.FileDescriptorProto.package");
    target = stream->WriteStringMaybeAliased(2, _s, target);
  }

  // repeated string dependency = 3;
  for (int i = 0, n = this_._internal_dependency_size(); i < n; ++i) {
    const auto& s = this_._internal_dependency().Get(i);
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(s.data(), static_cast<int>(s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.FileDescriptorProto.dependency");
    target = stream->WriteString(3, s, target);
  }

  // repeated .google.protobuf.DescriptorProto message_type = 4;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_message_type_size());
       i < n; i++) {
    const auto& repfield = this_._internal_message_type().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            4, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_enum_type_size());
       i < n; i++) {
    const auto& repfield = this_._internal_enum_type().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            5, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.ServiceDescriptorProto service = 6;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_service_size());
       i < n; i++) {
    const auto& repfield = this_._internal_service().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            6, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 7;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_extension_size());
       i < n; i++) {
    const auto& repfield = this_._internal_extension().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            7, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // optional .google.protobuf.FileOptions options = 8;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        8, *this_._impl_.options_, this_._impl_.options_->GetCachedSize(), target,
        stream);
  }

  // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
  if ((cached_has_bits & 0x00000010u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        9, *this_._impl_.source_code_info_, this_._impl_.source_code_info_->GetCachedSize(), target,
        stream);
  }

  // repeated int32 public_dependency = 10;
  for (int i = 0, n = this_._internal_public_dependency_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        10, this_._internal_public_dependency().Get(i), target);
  }

  // repeated int32 weak_dependency = 11;
  for (int i = 0, n = this_._internal_weak_dependency_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        11, this_._internal_weak_dependency().Get(i), target);
  }

  // optional string syntax = 12;
  if ((cached_has_bits & 0x00000004u) != 0) {
    const ::std::string& _s = this_._internal_syntax();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.FileDescriptorProto.syntax");
    target = stream->WriteStringMaybeAliased(12, _s, target);
  }

  // optional .google.protobuf.Edition edition = 14;
  if ((cached_has_bits & 0x00000020u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        14, this_._internal_edition(), target);
  }

  // repeated string option_dependency = 15;
  for (int i = 0, n = this_._internal_option_dependency_size(); i < n; ++i) {
    const auto& s = this_._internal_option_dependency().Get(i);
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(s.data(), static_cast<int>(s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.FileDescriptorProto.option_dependency");
    target = stream->WriteString(15, s, target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FileDescriptorProto)
  return target;
}